

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> __thiscall
cmGlobalNinjaGenerator::CreateLinkLineComputer
          (cmGlobalNinjaGenerator *this,cmOutputConverter *outputConverter,cmStateDirectory *param_2
          )

{
  const_reference this_00;
  pointer this_01;
  cmStateSnapshot local_70;
  cmStateDirectory local_58;
  unique_ptr<cmNinjaLinkLineComputer,_std::default_delete<cmNinjaLinkLineComputer>_> local_30 [2];
  cmStateDirectory *param_2_local;
  cmOutputConverter *outputConverter_local;
  cmGlobalNinjaGenerator *this_local;
  
  param_2_local = param_2;
  outputConverter_local = outputConverter;
  this_local = this;
  this_00 = std::
            vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ::operator[]((vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                          *)&outputConverter[1].RelativePathTopSource.field_2,0);
  this_01 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                      (this_00);
  cmLocalGenerator::GetStateSnapshot(&local_70,this_01);
  cmStateSnapshot::GetDirectory(&local_58,&local_70);
  std::
  make_unique<cmNinjaLinkLineComputer,cmOutputConverter*&,cmStateDirectory,cmGlobalNinjaGenerator_const*>
            ((cmOutputConverter **)local_30,(cmStateDirectory *)&param_2_local,
             (cmGlobalNinjaGenerator **)&local_58);
  std::unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>>::
  unique_ptr<cmNinjaLinkLineComputer,std::default_delete<cmNinjaLinkLineComputer>,void>
            ((unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>> *)this,local_30
            );
  std::unique_ptr<cmNinjaLinkLineComputer,_std::default_delete<cmNinjaLinkLineComputer>_>::
  ~unique_ptr(local_30);
  return (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmLinkLineComputer>
cmGlobalNinjaGenerator::CreateLinkLineComputer(
  cmOutputConverter* outputConverter,
  cmStateDirectory const& /* stateDir */) const
{
  return std::unique_ptr<cmLinkLineComputer>(
    cm::make_unique<cmNinjaLinkLineComputer>(
      outputConverter,
      this->LocalGenerators[0]->GetStateSnapshot().GetDirectory(), this));
}